

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profile.c
# Opt level: O3

int32 host_endian(void)

{
  FILE *__s;
  size_t sVar1;
  char *fmt;
  long ln;
  int32 k;
  char buf [8];
  undefined4 local_1c;
  char local_18 [8];
  
  __s = fopen("/tmp/__EnDiAn_TeSt__","wb");
  if (__s == (FILE *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/profile.c"
            ,0x138,"Failed to open file \'%s\' for writing","/tmp/__EnDiAn_TeSt__");
    return -1;
  }
  local_1c = 0x11223344;
  sVar1 = fwrite(&local_1c,4,1,__s);
  if (sVar1 == 1) {
    fclose(__s);
    __s = fopen("/tmp/__EnDiAn_TeSt__","rb");
    if (__s == (FILE *)0x0) {
      err_msg_system(ERR_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/profile.c"
                     ,0x148,"Failed to open file \'%s\' for reading","/tmp/__EnDiAn_TeSt__");
      goto LAB_00115d3f;
    }
    sVar1 = fread(local_18,1,4,__s);
    if (sVar1 == 4) {
      fclose(__s);
      unlink("/tmp/__EnDiAn_TeSt__");
      return (uint)(local_18[0] == 'D');
    }
    fmt = "Failed to read from file \'%s\'\n";
    ln = 0x14d;
  }
  else {
    fmt = "Failed to write to file \'%s\'\n";
    ln = 0x140;
  }
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/profile.c"
          ,ln,fmt,"/tmp/__EnDiAn_TeSt__");
  fclose(__s);
LAB_00115d3f:
  unlink("/tmp/__EnDiAn_TeSt__");
  return -1;
}

Assistant:

int32
host_endian(void)
{
    FILE *fp;
    int32 BYTE_ORDER_MAGIC;
    char *file;
    char buf[8];
    int32 k, endian;

    file = "/tmp/__EnDiAn_TeSt__";

    if ((fp = fopen(file, "wb")) == NULL) {
        E_ERROR("Failed to open file '%s' for writing", file);
        return -1;
    }

    BYTE_ORDER_MAGIC = (int32) 0x11223344;

    k = (int32) BYTE_ORDER_MAGIC;
    if (fwrite(&k, sizeof(int32), 1, fp) != 1) {
        E_ERROR("Failed to write to file '%s'\n", file);
        fclose(fp);
        unlink(file);
        return -1;
    }

    fclose(fp);
    if ((fp = fopen(file, "rb")) == NULL) {
        E_ERROR_SYSTEM("Failed to open file '%s' for reading", file);
        unlink(file);
        return -1;
    }
    if (fread(buf, 1, sizeof(int32), fp) != sizeof(int32)) {
        E_ERROR("Failed to read from file '%s'\n", file);
        fclose(fp);
        unlink(file);
        return -1;
    }
    fclose(fp);
    unlink(file);

    /* If buf[0] == lsB of BYTE_ORDER_MAGIC, we are little-endian */
    endian = (buf[0] == (BYTE_ORDER_MAGIC & 0x000000ff)) ? 1 : 0;

    return (endian);
}